

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O3

bool __thiscall
Js::
MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
::Iterator::Next(Iterator *this)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar4;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar5;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar6;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *pMVar7;
  
  pMVar4 = (this->list).ptr;
  if ((pMVar4 != (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                  *)0x0) &&
     (pMVar7 = (pMVar4->first).ptr,
     pMVar7 != (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                *)0x0)) {
    addr = &this->current;
    pMVar5 = (this->current).ptr;
    if (pMVar5 != (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                   *)0x0) {
      pMVar6 = (pMVar5->prev).ptr;
      if (pMVar6 != (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                     *)0x0) {
        do {
          if ((pMVar6->next).ptr == pMVar5) {
            pMVar4 = (this->list).ptr;
            goto LAB_008bb7fb;
          }
          Memory::Recycler::WBSetBit((char *)addr);
          addr->ptr = pMVar6;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          pMVar5 = addr->ptr;
          pMVar6 = (pMVar5->prev).ptr;
        } while (pMVar6 != (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                            *)0x0);
        pMVar4 = (this->list).ptr;
        pMVar7 = (pMVar4->first).ptr;
      }
      if (pMVar5 != pMVar7) {
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pMVar7;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        if (addr->ptr !=
            (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
             *)0x0) {
          return true;
        }
        goto LAB_008bb908;
      }
LAB_008bb7fb:
      if (((pMVar5->next).ptr !=
           (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            *)0x0) || (pMVar7 = (pMVar4->last).ptr, pMVar5 == pMVar7)) {
        if (pMVar5 == (pMVar4->last).ptr) goto LAB_008bb908;
        pMVar7 = (pMVar5->next).ptr;
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pMVar7;
        goto LAB_008bb8fc;
      }
      if (pMVar7 != (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                     *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                    ,100,"(list->last == nullptr)","list->last == nullptr");
        if (!bVar2) goto LAB_008bb919;
        *puVar3 = 0;
        pMVar4 = (this->list).ptr;
      }
      addr->ptr = (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                   *)0x0;
    }
    if ((pMVar4->last).ptr !=
        (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
         *)0x0) {
      pMVar7 = (pMVar4->first).ptr;
      if (pMVar7 == (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                     *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                    ,0x6d,"(list->first != nullptr)","list->first != nullptr");
        if (!bVar2) {
LAB_008bb919:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        pMVar7 = (((this->list).ptr)->first).ptr;
      }
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pMVar7;
LAB_008bb8fc:
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      return true;
    }
  }
LAB_008bb908:
  (this->list).ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)0x0;
  (this->current).ptr =
       (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)0x0;
  return false;
}

Assistant:

bool Next()
            {
                // Nodes can be deleted while iterating so validate current
                // and if it is not valid find last valid node by following
                // previous toward first.
                // Note: clear will simply null out first and last, but
                // not invalidated nodes, so we must also check to see that
                // first is not null

                if (list == nullptr || list->first == nullptr)
                {
                    // list is empty or was cleared during enumeration
                    list = nullptr;
                    current = nullptr;
                    return false;
                }

                if (current)
                {
                    while (current->prev && current->prev->next != current)
                    {
                        current = current->prev;
                    }

                    if (current->prev == nullptr && current != list->first)
                    {
                        current = list->first;

                        if (current != nullptr)
                        {
                            return true;
                        }

                        list = nullptr;
                        current = nullptr;
                        return false;
                    }

                    if (current->next == nullptr && current != list->last)
                    {
                        Assert(list->last == nullptr);
                        current = nullptr;
                    }
                }

                if (current != list->last)
                {
                    if (current == nullptr)
                    {
                        Assert(list->first != nullptr);
                        current = list->first;
                    }
                    else
                    {
                        current = current->next;
                    }
                    return true;
                }

                list = nullptr;
                current = nullptr;
                return false;
            }